

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

UniValue *
JSONRPCReplyObj(UniValue *__return_storage_ptr__,UniValue result,UniValue error,
               optional<UniValue> id,JSONRPCVersion jsonrpc_version)

{
  UniValue *pUVar1;
  optional<UniValue> *in_RCX;
  UniValue *in_RDX;
  undefined4 in_register_00000034;
  string *this;
  int in_R8D;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffcc8;
  UniValue in_stack_fffffffffffffce8;
  UniValue local_2b0;
  string local_258 [32];
  UniValue local_238;
  string local_1e0 [32];
  UniValue local_1c0;
  string local_168 [32];
  UniValue local_148;
  string local_f0 [32];
  UniValue local_d0;
  string local_78 [32];
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = local_48;
  local_50 = 0;
  local_48[0] = 0;
  UniValue::UniValue(__return_storage_ptr__,VOBJ,in_stack_fffffffffffffcc8);
  std::__cxx11::string::~string((string *)&local_58);
  if (in_R8D == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_78,"jsonrpc",(allocator<char> *)&stack0xfffffffffffffcd7);
    UniValue::UniValue<const_char_(&)[4],_char[4],_true>(&local_d0,(char (*) [4])"2.0");
    UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
    UniValue::~UniValue(&local_d0);
    std::__cxx11::string::~string(local_78);
    if (in_RDX->typ != VNULL) goto LAB_0013e01b;
LAB_0013e076:
    std::__cxx11::string::string<std::allocator<char>>
              (local_f0,"result",(allocator<char> *)&stack0xfffffffffffffcd7);
    UniValue::UniValue(&local_148,(UniValue *)CONCAT44(in_register_00000034,jsonrpc_version));
    UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
    UniValue::~UniValue(&local_148);
    std::__cxx11::string::~string(local_f0);
    if (in_R8D != 0) goto LAB_0013e0d7;
    std::__cxx11::string::string<std::allocator<char>>
              (local_168,"error",(allocator<char> *)&stack0xfffffffffffffcd7);
    UniValue::UniValue(&local_1c0,&NullUniValue);
    UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
    UniValue::~UniValue(&local_1c0);
    this = local_168;
  }
  else {
    if (in_RDX->typ == VNULL) goto LAB_0013e076;
    if (in_R8D == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                (local_1e0,"result",(allocator<char> *)&stack0xfffffffffffffcd7);
      UniValue::UniValue(&local_238,&NullUniValue);
      UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
      UniValue::~UniValue(&local_238);
      std::__cxx11::string::~string(local_1e0);
    }
LAB_0013e01b:
    std::__cxx11::string::string<std::allocator<char>>
              (local_258,"error",(allocator<char> *)&stack0xfffffffffffffcd7);
    UniValue::UniValue(&local_2b0,in_RDX);
    UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
    UniValue::~UniValue(&local_2b0);
    this = local_258;
  }
  std::__cxx11::string::~string(this);
LAB_0013e0d7:
  if ((in_RCX->super__Optional_base<UniValue,_false,_false>)._M_payload.
      super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
      _M_engaged == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffd30,"id",(allocator<char> *)&stack0xfffffffffffffcd7);
    pUVar1 = std::optional<UniValue>::value(in_RCX);
    UniValue::UniValue((UniValue *)&stack0xfffffffffffffcd8,pUVar1);
    UniValue::pushKV(__return_storage_ptr__,in_stack_fffffffffffffcc8,in_stack_fffffffffffffce8);
    UniValue::~UniValue((UniValue *)&stack0xfffffffffffffcd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue JSONRPCReplyObj(UniValue result, UniValue error, std::optional<UniValue> id, JSONRPCVersion jsonrpc_version)
{
    UniValue reply(UniValue::VOBJ);
    // Add JSON-RPC version number field in v2 only.
    if (jsonrpc_version == JSONRPCVersion::V2) reply.pushKV("jsonrpc", "2.0");

    // Add both result and error fields in v1, even though one will be null.
    // Omit the null field in v2.
    if (error.isNull()) {
        reply.pushKV("result", std::move(result));
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("error", NullUniValue);
    } else {
        if (jsonrpc_version == JSONRPCVersion::V1_LEGACY) reply.pushKV("result", NullUniValue);
        reply.pushKV("error", std::move(error));
    }
    if (id.has_value()) reply.pushKV("id", std::move(id.value()));
    return reply;
}